

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int archive_read_format_cpio_read_header(archive_read *a,archive_entry *entry)

{
  void *pvVar1;
  wchar_t wVar2;
  mode_t mVar3;
  int iVar4;
  archive_string_conv *paVar5;
  int *piVar6;
  char *pcVar7;
  archive_entry *in_RSI;
  archive_read *in_RDI;
  int r;
  size_t name_pad;
  size_t namelength;
  archive_string_conv *sconv;
  void *h;
  cpio *cpio;
  archive_read *in_stack_ffffffffffffffa8;
  archive_read *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  archive_entry *in_stack_ffffffffffffffc0;
  archive_read *in_stack_ffffffffffffffc8;
  archive_string_conv *local_30;
  char *local_28;
  int local_4;
  
  pvVar1 = in_RDI->format->data;
  local_30 = *(archive_string_conv **)((long)pvVar1 + 0x38);
  if (local_30 == (archive_string_conv *)0x0) {
    if (*(int *)((long)pvVar1 + 0x48) == 0) {
      paVar5 = archive_string_default_conversion_for_read((archive_conflict *)in_RDI);
      *(archive_string_conv **)((long)pvVar1 + 0x40) = paVar5;
      *(undefined4 *)((long)pvVar1 + 0x48) = 1;
    }
    local_30 = *(archive_string_conv **)((long)pvVar1 + 0x40);
  }
  local_4 = (**(code **)((long)pvVar1 + 8))
                      (in_RDI,pvVar1,in_RSI,&stack0xffffffffffffffc8,&stack0xffffffffffffffc0);
  if (-0x15 < local_4) {
    local_28 = (char *)__archive_read_ahead
                                 (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
                                  (ssize_t *)0x147ef7);
    if (local_28 == (char *)0x0) {
      local_4 = -0x1e;
    }
    else {
      wVar2 = _archive_entry_copy_pathname_l
                        (in_stack_ffffffffffffffc0,
                         (char *)CONCAT44(local_4,in_stack_ffffffffffffffb8),
                         (size_t)in_stack_ffffffffffffffb0,
                         (archive_string_conv *)in_stack_ffffffffffffffa8);
      if (wVar2 != L'\0') {
        piVar6 = __errno_location();
        if (*piVar6 == 0xc) {
          archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate memory for Pathname");
          return -0x1e;
        }
        in_stack_ffffffffffffffb0 = in_RDI;
        pcVar7 = archive_string_conversion_charset_name(local_30);
        archive_set_error(&in_stack_ffffffffffffffb0->archive,0x54,
                          "Pathname can\'t be converted from %s to current locale.",pcVar7);
        local_4 = -0x14;
      }
      *(undefined8 *)((long)pvVar1 + 0x28) = 0;
      __archive_read_consume(in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8);
      mVar3 = archive_entry_filetype(in_RSI);
      if (mVar3 == 0xa000) {
        local_28 = (char *)__archive_read_ahead
                                     (in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8,
                                      (ssize_t *)0x147fe2);
        if (local_28 == (char *)0x0) {
          return -0x1e;
        }
        wVar2 = _archive_entry_copy_symlink_l
                          (in_stack_ffffffffffffffc0,
                           (char *)CONCAT44(local_4,in_stack_ffffffffffffffb8),
                           (size_t)in_stack_ffffffffffffffb0,
                           (archive_string_conv *)in_stack_ffffffffffffffa8);
        if (wVar2 != L'\0') {
          piVar6 = __errno_location();
          if (*piVar6 == 0xc) {
            archive_set_error(&in_RDI->archive,0xc,"Can\'t allocate memory for Linkname");
            return -0x1e;
          }
          in_stack_ffffffffffffffa8 = in_RDI;
          pcVar7 = archive_string_conversion_charset_name(local_30);
          archive_set_error(&in_stack_ffffffffffffffa8->archive,0x54,
                            "Linkname can\'t be converted from %s to current locale.",pcVar7);
          local_4 = -0x14;
        }
        __archive_read_consume(in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8);
        *(undefined8 *)((long)pvVar1 + 0x18) = 0;
      }
      if ((in_stack_ffffffffffffffc8 == (archive_read *)0xb) &&
         (iVar4 = strcmp(local_28,"TRAILER!!!"), iVar4 == 0)) {
        archive_clear_error(&in_RDI->archive);
        local_4 = 1;
      }
      else {
        iVar4 = record_hardlink(in_stack_ffffffffffffffc8,(cpio *)in_stack_ffffffffffffffc0,
                                (archive_entry *)CONCAT44(local_4,in_stack_ffffffffffffffb8));
        if (iVar4 != 0) {
          local_4 = -0x1e;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_read_format_cpio_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct cpio *cpio;
	const void *h;
	struct archive_string_conv *sconv;
	size_t namelength;
	size_t name_pad;
	int r;

	cpio = (struct cpio *)(a->format->data);
	sconv = cpio->opt_sconv;
	if (sconv == NULL) {
		if (!cpio->init_default_conversion) {
			cpio->sconv_default =
			    archive_string_default_conversion_for_read(
			      &(a->archive));
			cpio->init_default_conversion = 1;
		}
		sconv = cpio->sconv_default;
	}
	
	r = (cpio->read_header(a, cpio, entry, &namelength, &name_pad));

	if (r < ARCHIVE_WARN)
		return (r);

	/* Read name from buffer. */
	h = __archive_read_ahead(a, namelength + name_pad, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);
	if (archive_entry_copy_pathname_l(entry,
	    (const char *)h, namelength, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname can't be converted from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		r = ARCHIVE_WARN;
	}
	cpio->entry_offset = 0;

	__archive_read_consume(a, namelength + name_pad);

	/* If this is a symlink, read the link contents. */
	if (archive_entry_filetype(entry) == AE_IFLNK) {
		h = __archive_read_ahead(a,
			(size_t)cpio->entry_bytes_remaining, NULL);
		if (h == NULL)
			return (ARCHIVE_FATAL);
		if (archive_entry_copy_symlink_l(entry, (const char *)h,
		    (size_t)cpio->entry_bytes_remaining, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Linkname can't be converted from %s to "
			    "current locale.",
			    archive_string_conversion_charset_name(sconv));
			r = ARCHIVE_WARN;
		}
		__archive_read_consume(a, cpio->entry_bytes_remaining);
		cpio->entry_bytes_remaining = 0;
	}

	/* XXX TODO: If the full mode is 0160200, then this is a Solaris
	 * ACL description for the following entry.  Read this body
	 * and parse it as a Solaris-style ACL, then read the next
	 * header.  XXX */

	/* Compare name to "TRAILER!!!" to test for end-of-archive. */
	if (namelength == 11 && strcmp((const char *)h, "TRAILER!!!") == 0) {
		/* TODO: Store file location of start of block. */
		archive_clear_error(&a->archive);
		return (ARCHIVE_EOF);
	}

	/* Detect and record hardlinks to previously-extracted entries. */
	if (record_hardlink(a, cpio, entry) != ARCHIVE_OK) {
		return (ARCHIVE_FATAL);
	}

	return (r);
}